

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

void __thiscall QUrlQuery::QUrlQuery(QUrlQuery *this,QUrl *url)

{
  bool bVar1;
  QUrlQueryPrivate *this_00;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d.ptr = (QUrlQueryPrivate *)0x0;
  bVar1 = QUrl::hasQuery(url);
  if (bVar1) {
    this_00 = (QUrlQueryPrivate *)operator_new(0x28);
    QUrl::query(&local_38,url,(ComponentFormattingOptions)0x0);
    QUrlQueryPrivate::QUrlQueryPrivate(this_00,&local_38);
    QSharedDataPointer<QUrlQueryPrivate>::reset(&this->d,this_00);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUrlQuery::QUrlQuery(const QUrl &url)
    : d(nullptr)
{
    // use internals to avoid unnecessary recoding
    // ### FIXME: actually do it
    if (url.hasQuery())
        d = new QUrlQueryPrivate(url.query());
}